

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char_*,_short> * __thiscall
fmt::v9::make_format_args<fmt::v9::basic_format_context<fmt::v9::appender,char>,char*&,short&>
          (format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char_*,_short>
           *__return_storage_ptr__,v9 *this,char **args,short *args_1)

{
  bool formattable;
  bool formattable_pointer;
  bool formattable_const;
  bool formattable_char;
  char_type **arg;
  bool formattable_1;
  bool formattable_pointer_1;
  bool formattable_const_1;
  bool formattable_char_1;
  int *arg_1;
  short *args_local_1;
  char **args_local;
  longlong local_38;
  size_t local_30;
  
  local_38._0_4_ = (int)*(short *)args;
  (__return_storage_ptr__->data_).args_[0].field_0.long_long_value = *(longlong *)this;
  (__return_storage_ptr__->data_).args_[0].field_0.custom.format =
       (_func_void_void_ptr_parse_context_ptr_basic_format_context<fmt::v9::appender,_char>_ptr *)
       args_local_1;
  (__return_storage_ptr__->data_).args_[1].field_0.long_long_value = local_38;
  (__return_storage_ptr__->data_).args_[1].field_0.string.size = local_30;
  return __return_storage_ptr__;
}

Assistant:

constexpr auto make_format_args(Args&&... args)
    -> format_arg_store<Context, remove_cvref_t<Args>...> {
  return {FMT_FORWARD(args)...};
}